

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

wchar_t * StringFromPropType(Types vt)

{
  wchar_t *pwStack_10;
  Types vt_local;
  
  switch(vt) {
  case Null:
  default:
    pwStack_10 = L"null";
    break;
  case Bool:
    pwStack_10 = L"bool";
    break;
  case Integer:
    pwStack_10 = L"int";
    break;
  case Float:
    pwStack_10 = L"float";
    break;
  case Double:
    pwStack_10 = L"double";
    break;
  case String:
    pwStack_10 = L"string";
    break;
  case DoubleArray2:
    pwStack_10 = L"2da";
    break;
  case DoubleArray3:
    pwStack_10 = L"3da";
    break;
  case DoubleArray4:
    pwStack_10 = L"4da";
    break;
  case DoubleColor4:
    pwStack_10 = L"color";
    break;
  case Matrix:
    pwStack_10 = L"matrix";
    break;
  case Uuid:
    pwStack_10 = L"uuid";
    break;
  case Time:
    pwStack_10 = L"time";
    break;
  case Buffer:
    pwStack_10 = L"buffer";
  }
  return pwStack_10;
}

Assistant:

static const wchar_t* StringFromPropType(ON_XMLVariant::Types vt)
{
  switch (vt)
  {
  case ON_XMLVariant::Types::Integer:      return L"int";
  case ON_XMLVariant::Types::Float:        return L"float";
  case ON_XMLVariant::Types::Double:       return L"double";
  case ON_XMLVariant::Types::String:       return L"string";
  case ON_XMLVariant::Types::Bool:         return L"bool";
  case ON_XMLVariant::Types::Matrix:       return L"matrix";
  case ON_XMLVariant::Types::Uuid:         return L"uuid";
  case ON_XMLVariant::Types::Time:         return L"time";
  case ON_XMLVariant::Types::Buffer:       return L"buffer";
  case ON_XMLVariant::Types::DoubleColor4: return L"color";
  case ON_XMLVariant::Types::DoubleArray2: return L"2da";
  case ON_XMLVariant::Types::DoubleArray3: return L"3da";
  case ON_XMLVariant::Types::DoubleArray4: return L"4da";
  case ON_XMLVariant::Types::Null:
  default:
    return L"null";
  }
}